

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O2

Aig_Obj_t * Aig_ObjCreate(Aig_Man_t *p,Aig_Obj_t *pGhost)

{
  Vec_Int_t *pVVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  Aig_Obj_t *pObj;
  int *piVar5;
  int iVar7;
  int iVar8;
  int iVar9;
  char *__assertion;
  ulong uVar10;
  long lVar6;
  
  if (((ulong)pGhost & 1) == 0) {
    if ((*(uint *)&pGhost->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assertion = "Aig_ObjIsHash(pGhost)";
      uVar4 = 0x5d;
    }
    else {
      pObj = Aig_ManFetchMemory(p);
      *(ulong *)&pObj->field_0x18 =
           *(ulong *)&pObj->field_0x18 & 0xfffffffffffffff8 |
           (ulong)((uint)*(undefined8 *)&pGhost->field_0x18 & 7);
      Aig_ObjConnect(p,pObj,pGhost->pFanin0,pGhost->pFanin1);
      p->nObjs[*(uint *)&pObj->field_0x18 & 7] = p->nObjs[*(uint *)&pObj->field_0x18 & 7] + 1;
      if ((pObj->field_5).pData == (void *)0x0) {
        if (p->vProbs != (Vec_Int_t *)0x0) {
          iVar7 = -1;
          iVar9 = iVar7;
          if (pObj->pFanin0 != (Aig_Obj_t *)0x0) {
            iVar9 = *(int *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x24);
          }
          fVar2 = (float)Vec_IntEntry(p->vProbs,iVar9);
          if (pObj->pFanin1 != (Aig_Obj_t *)0x0) {
            iVar7 = *(int *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x24);
          }
          fVar3 = (float)Vec_IntEntry(p->vProbs,iVar7);
          if (((ulong)pObj->pFanin0 & 1) != 0) {
            fVar2 = 1.0 - fVar2;
          }
          if (((ulong)pObj->pFanin1 & 1) != 0) {
            fVar3 = 1.0 - fVar3;
          }
          pVVar1 = p->vProbs;
          iVar9 = pObj->Id;
          uVar4 = pVVar1->nSize;
          if (iVar9 < (int)uVar4) {
            uVar10 = (ulong)uVar4;
          }
          else {
            uVar10 = (long)iVar9 + 1;
            iVar7 = pVVar1->nCap;
            iVar8 = (int)uVar10;
            if (((iVar7 * 2 <= iVar9) || (iVar8 = iVar7 * 2, iVar7 <= iVar9)) && (iVar7 < iVar8)) {
              if (pVVar1->pArray == (int *)0x0) {
                piVar5 = (int *)malloc((long)iVar8 << 2);
              }
              else {
                piVar5 = (int *)realloc(pVVar1->pArray,(long)iVar8 << 2);
              }
              pVVar1->pArray = piVar5;
              if (piVar5 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              pVVar1->nCap = iVar8;
              uVar4 = pVVar1->nSize;
            }
            for (lVar6 = (long)(int)uVar4; lVar6 < (long)uVar10; lVar6 = lVar6 + 1) {
              pVVar1->pArray[lVar6] = 0;
            }
            pVVar1->nSize = (int)uVar10;
          }
          if ((iVar9 < 0) || ((int)uVar10 <= iVar9)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar1->pArray[iVar9] = (int)(fVar2 * fVar3);
        }
        return pObj;
      }
      __assertion = "pObj->pData == NULL";
      uVar4 = 0x66;
    }
  }
  else {
    __assertion = "!Aig_IsComplement(pGhost)";
    uVar4 = 0x5c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigObj.c"
                ,uVar4,"Aig_Obj_t *Aig_ObjCreate(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

Aig_Obj_t * Aig_ObjCreate( Aig_Man_t * p, Aig_Obj_t * pGhost )
{
    Aig_Obj_t * pObj;
    assert( !Aig_IsComplement(pGhost) );
    assert( Aig_ObjIsHash(pGhost) );
//    assert( pGhost == &p->Ghost );
    // get memory for the new object
    pObj = Aig_ManFetchMemory( p );
    pObj->Type = pGhost->Type;
    // add connections
    Aig_ObjConnect( p, pObj, pGhost->pFanin0, pGhost->pFanin1 );
    // update node counters of the manager
    p->nObjs[Aig_ObjType(pObj)]++;
    assert( pObj->pData == NULL );
    // create the power counter
    if ( p->vProbs )
    {
        float Prob0 = Abc_Int2Float( Vec_IntEntry( p->vProbs, Aig_ObjFaninId0(pObj) ) );
        float Prob1 = Abc_Int2Float( Vec_IntEntry( p->vProbs, Aig_ObjFaninId1(pObj) ) );
        Prob0 = Aig_ObjFaninC0(pObj)? 1.0 - Prob0 : Prob0;
        Prob1 = Aig_ObjFaninC1(pObj)? 1.0 - Prob1 : Prob1;
        Vec_IntSetEntry( p->vProbs, pObj->Id, Abc_Float2Int(Prob0 * Prob1) );
    }
    return pObj;
}